

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O0

DecodedResult * bech32::decode(DecodedResult *__return_storage_ptr__,string *bstring)

{
  bool bVar1;
  undefined1 local_50 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> dp;
  string hrp;
  string *bstring_local;
  
  anon_unknown.dwarf_597::rejectBStringThatIsntWellFormed(bstring);
  anon_unknown.dwarf_597::extractHumanReadablePart
            ((string *)
             &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,bstring);
  anon_unknown.dwarf_597::extractDataPart
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50,bstring);
  anon_unknown.dwarf_597::rejectHRPTooShort
            ((string *)
             &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown.dwarf_597::rejectHRPTooLong
            ((string *)
             &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown.dwarf_597::rejectDPTooShort
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  anon_unknown.dwarf_597::convertToLowercase
            ((string *)
             &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  anon_unknown.dwarf_597::mapDP((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  bVar1 = anon_unknown.dwarf_597::verifyChecksum
                    ((string *)
                     &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  if (bVar1) {
    anon_unknown.dwarf_597::stripChecksum
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    __return_storage_ptr__->encoding = Bech32m;
    std::__cxx11::string::string
              ((string *)&__return_storage_ptr__->hrp,
               (string *)
               &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&__return_storage_ptr__->dp,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  }
  else {
    bVar1 = anon_unknown.dwarf_597::verifyChecksumUsingOriginalConstant
                      ((string *)
                       &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage,
                       (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    if (bVar1) {
      anon_unknown.dwarf_597::stripChecksum
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
      __return_storage_ptr__->encoding = Bech32;
      std::__cxx11::string::string
                ((string *)&__return_storage_ptr__->hrp,
                 (string *)
                 &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (&__return_storage_ptr__->dp,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
    }
    else {
      memset(__return_storage_ptr__,0,0x40);
      DecodedResult::DecodedResult(__return_storage_ptr__);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_50);
  std::__cxx11::string::~string
            ((string *)
             &dp.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

DecodedResult decode(const std::string & bstring) {
        rejectBStringThatIsntWellFormed(bstring);
        std::string hrp = extractHumanReadablePart(bstring);
        std::vector<unsigned char> dp = extractDataPart(bstring);
        rejectHRPTooShort(hrp);
        rejectHRPTooLong(hrp);
        rejectDPTooShort(dp);
        convertToLowercase(hrp);
        mapDP(dp);
        if (verifyChecksum(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32m, hrp, dp};
        }
        else if (verifyChecksumUsingOriginalConstant(hrp, dp)) {
            stripChecksum(dp);
            return {bech32::Encoding::Bech32, hrp, dp};
        }
        else {
            return DecodedResult();
        }
    }